

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O0

bool r_exec::_Fact::Match
               (Code *lhs,uint16_t lhs_base_index,uint16_t lhs_index,Code *rhs,uint16_t rhs_index,
               uint16_t lhs_arity)

{
  undefined1 uVar1;
  byte bVar2;
  bool bVar3;
  uint16_t lhs_base_index_00;
  uint16_t rhs_index_00;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint *puVar8;
  undefined8 uVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_38;
  undefined4 local_34;
  Atom rhs_atom;
  Atom lhs_atom;
  uint16_t lhs_full_index;
  uint16_t lhs_arity_local;
  uint16_t rhs_index_local;
  Code *rhs_local;
  uint16_t lhs_index_local;
  uint16_t lhs_base_index_local;
  Code *lhs_local;
  
  iVar5 = (*(lhs->super__Object)._vptr__Object[5])(lhs,(ulong)(ushort)(lhs_base_index + lhs_index));
  local_34 = *(undefined4 *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*(rhs->super__Object)._vptr__Object[5])(rhs,(ulong)rhs_index);
  local_38 = *(undefined4 *)CONCAT44(extraout_var_00,iVar5);
  uVar1 = r_code::Atom::getDescriptor();
  puVar8 = &switchD_0022adfa::switchdataD_002a484c;
  switch(uVar1) {
  case 0x82:
  case 0x83:
  case 0x86:
    break;
  case 0x84:
    bVar2 = r_code::Atom::getDescriptor();
    uVar6 = (uint)bVar2;
    if (1 < uVar6 - 0x82) {
      if (uVar6 == 0x84) {
        lhs_base_index_00 = r_code::Atom::asIndex();
        rhs_index_00 = r_code::Atom::asIndex();
        bVar3 = MatchStructure(lhs,lhs_base_index_00,0,rhs,rhs_index_00);
        if (!bVar3) {
          lhs_local._7_1_ = false;
          goto LAB_0022b149;
        }
      }
      else if (uVar6 != 0x86) {
        lhs_local._7_1_ = false;
        goto LAB_0022b149;
      }
    }
    break;
  case 0x85:
    bVar2 = r_code::Atom::getDescriptor();
    uVar6 = (uint)bVar2;
    if (1 < uVar6 - 0x82) {
      if (uVar6 == 0x85) {
        uVar4 = r_code::Atom::asIndex();
        uVar9 = CONCAT62((int6)((ulong)puVar8 >> 0x10),uVar4);
        iVar5 = (*(lhs->super__Object)._vptr__Object[9])(lhs,(ulong)uVar4,extraout_RDX,uVar9);
        uVar4 = r_code::Atom::asIndex();
        iVar7 = (*(rhs->super__Object)._vptr__Object[9])
                          (rhs,(ulong)uVar4,extraout_RDX_00,
                           CONCAT62((int6)((ulong)uVar9 >> 0x10),uVar4));
        bVar3 = MatchObject((Code *)CONCAT44(extraout_var_01,iVar5),
                            (Code *)CONCAT44(extraout_var_02,iVar7));
        if (!bVar3) {
          lhs_local._7_1_ = false;
          goto LAB_0022b149;
        }
      }
      else if (uVar6 != 0x86) {
        lhs_local._7_1_ = false;
        goto LAB_0022b149;
      }
    }
    break;
  default:
    bVar2 = r_code::Atom::getDescriptor();
    if ((1 < bVar2 - 0x82) && (bVar2 != 0x86)) {
      local_4c = local_34;
      local_50 = local_38;
      bVar3 = MatchAtom((Atom *)&local_4c,(Atom *)&local_50);
      r_code::Atom::~Atom((Atom *)&local_50);
      r_code::Atom::~Atom((Atom *)&local_4c);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        lhs_local._7_1_ = false;
        goto LAB_0022b149;
      }
    }
  }
  if (lhs_index == lhs_arity) {
    lhs_local._7_1_ = true;
  }
  else {
    lhs_local._7_1_ = Match(lhs,lhs_base_index,lhs_index + 1,rhs,rhs_index + 1,lhs_arity);
  }
LAB_0022b149:
  local_48 = 1;
  r_code::Atom::~Atom((Atom *)&local_38);
  r_code::Atom::~Atom((Atom *)&local_34);
  return lhs_local._7_1_;
}

Assistant:

bool _Fact::Match(const Code *lhs, uint16_t lhs_base_index, uint16_t lhs_index, const Code *rhs, uint16_t rhs_index, uint16_t lhs_arity)
{
    uint16_t lhs_full_index = lhs_base_index + lhs_index;
    Atom lhs_atom = lhs->code(lhs_full_index);
    Atom rhs_atom = rhs->code(rhs_index);

    switch (lhs_atom.getDescriptor()) {
    case Atom::T_WILDCARD:
    case Atom::WILDCARD:
    case Atom::VL_PTR:
        break;

    case Atom::I_PTR:
        switch (rhs_atom.getDescriptor()) {
        case Atom::I_PTR:
            if (!MatchStructure(lhs, lhs_atom.asIndex(), 0, rhs, rhs_atom.asIndex())) {
                return false;
            }

            break;

        case Atom::T_WILDCARD:
        case Atom::WILDCARD:
        case Atom::VL_PTR:
            break;

        default:
            return false;
        }

        break;

    case Atom::R_PTR:
        switch (rhs_atom.getDescriptor()) {
        case Atom::R_PTR:
            if (!MatchObject(lhs->get_reference(lhs_atom.asIndex()), rhs->get_reference(rhs_atom.asIndex()))) {
                return false;
            }

            break;

        case Atom::T_WILDCARD:
        case Atom::WILDCARD:
        case Atom::VL_PTR:
            break;

        default:
            return false;
        }

        break;

    default:
        switch (rhs_atom.getDescriptor()) {
        case Atom::T_WILDCARD:
        case Atom::WILDCARD:
        case Atom::VL_PTR:
            break;

        default:
            if (!MatchAtom(lhs_atom, rhs_atom)) {
                return false;
            }

            break;
        }

        break;
    }

    if (lhs_index == lhs_arity) {
        return true;
    }

    return Match(lhs, lhs_base_index, lhs_index + 1, rhs, rhs_index + 1, lhs_arity);
}